

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

void __thiscall nuraft::snapshot_io_mgr::snapshot_io_mgr(snapshot_io_mgr *this)

{
  long in_RDI;
  thread *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  EventAwaiter *in_stack_ffffffffffffffa0;
  thread *in_stack_ffffffffffffffe0;
  
  std::thread::thread((thread *)0x236970);
  operator_new(0x60);
  EventAwaiter::EventAwaiter(in_stack_ffffffffffffffa0);
  std::shared_ptr<nuraft::EventAwaiter>::shared_ptr<nuraft::EventAwaiter,void>
            ((shared_ptr<nuraft::EventAwaiter> *)in_stack_ffffffffffffffa0,
             (EventAwaiter *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  this_00 = (thread *)(in_RDI + 0x20);
  std::__cxx11::
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ::list((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
          *)0x2369cf);
  std::mutex::mutex((mutex *)0x2369dd);
  std::thread::thread<void(nuraft::snapshot_io_mgr::*)(),nuraft::snapshot_io_mgr*,void>
            (in_stack_ffffffffffffffe0,(type *)0x0,(snapshot_io_mgr **)async_io_loop);
  std::thread::operator=
            (this_00,(thread *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::thread::~thread((thread *)0x236a2b);
  return;
}

Assistant:

snapshot_io_mgr::snapshot_io_mgr()
    : io_thread_ea_(new EventAwaiter())
    , terminating_(false)
{
    io_thread_ = std::thread(&snapshot_io_mgr::async_io_loop, this);
}